

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Program> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Program>(RecursiveDescentParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Program> sVar1;
  allocator local_31;
  undefined1 local_30 [32];
  
  std::make_shared<MyCompiler::Program>();
  parse<MyCompiler::Block>((RecursiveDescentParser *)local_30);
  std::__shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x48),
             (__shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__cxx11::string::string((string *)local_30,"period expected",&local_31);
  except(in_RSI,PERIOD,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  sVar1.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Program>)
         sVar1.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Program> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Program>();

    pResult->pBlock = parse<Block>();
    except(SymbolType::PERIOD, "period expected");

    return pResult;
}